

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O1

void QtPrivate::
     q_relocate_overlap_n_left_move<std::reverse_iterator<QSocks5RevivedDatagram*>,long_long>
               (reverse_iterator<QSocks5RevivedDatagram_*> first,longlong n,
               reverse_iterator<QSocks5RevivedDatagram_*> d_first)

{
  QSocks5RevivedDatagram *pQVar1;
  Data *pDVar2;
  Data *pDVar3;
  char *pcVar4;
  qsizetype qVar5;
  QHostAddressPrivate *pQVar6;
  QSocks5RevivedDatagram *pQVar7;
  int *piVar8;
  QSocks5RevivedDatagram *pQVar9;
  QSocks5RevivedDatagram *pQVar10;
  long in_FS_OFFSET;
  Destructor local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.end.current = (QSocks5RevivedDatagram *)((d_first.current)->data).d.d;
  pQVar7 = local_38.end.current + -n;
  pQVar1 = (QSocks5RevivedDatagram *)((first.current)->data).d.d;
  pQVar10 = pQVar1;
  pQVar9 = pQVar7;
  if (pQVar7 < pQVar1) {
    pQVar10 = pQVar7;
    pQVar9 = pQVar1;
  }
  pQVar1 = (QSocks5RevivedDatagram *)((d_first.current)->data).d.d;
  while (pQVar1 != pQVar9) {
    pDVar2 = ((first.current)->data).d.d;
    pDVar3 = (Data *)pDVar2[-3].super_QArrayData.alloc;
    pDVar2[-3].super_QArrayData.alloc = 0;
    pQVar1[-1].data.d.d = pDVar3;
    pcVar4 = *(char **)&pDVar2[-2].super_QArrayData;
    pDVar2[-2].super_QArrayData.ref_ = (Type)0x0;
    pDVar2[-2].super_QArrayData.flags = (QFlagsStorageHelper<QArrayData::ArrayOption,_4>)0x0;
    pQVar1[-1].data.d.ptr = pcVar4;
    qVar5 = pDVar2[-2].super_QArrayData.alloc;
    pDVar2[-2].super_QArrayData.alloc = 0;
    pQVar1[-1].data.d.size = qVar5;
    pQVar6 = *(QHostAddressPrivate **)&pDVar2[-1].super_QArrayData;
    pDVar2[-1].super_QArrayData.ref_ = (Type)0x0;
    pDVar2[-1].super_QArrayData.flags = (QFlagsStorageHelper<QArrayData::ArrayOption,_4>)0x0;
    pQVar1[-1].address.d.d.ptr = pQVar6;
    pQVar1[-1].port = (quint16)pDVar2[-1].super_QArrayData.alloc;
    ((d_first.current)->data).d.d =
         (Data *)&((d_first.current)->data).d.d[-3].super_QArrayData.alloc;
    ((first.current)->data).d.d = (Data *)&((first.current)->data).d.d[-3].super_QArrayData.alloc;
    pQVar1 = (QSocks5RevivedDatagram *)((d_first.current)->data).d.d;
  }
  local_38.iter = &local_38.end;
  local_38.intermediate.current = (QSocks5RevivedDatagram *)((d_first.current)->data).d.d;
  while (pQVar1 = (QSocks5RevivedDatagram *)((d_first.current)->data).d.d, pQVar1 != pQVar7) {
    pDVar2 = ((first.current)->data).d.d;
    pDVar3 = pQVar1[-1].data.d.d;
    pQVar1[-1].data.d.d = (Data *)pDVar2[-3].super_QArrayData.alloc;
    pDVar2[-3].super_QArrayData.alloc = (qsizetype)pDVar3;
    pcVar4 = pQVar1[-1].data.d.ptr;
    pQVar1[-1].data.d.ptr = *(char **)&pDVar2[-2].super_QArrayData;
    *(char **)&pDVar2[-2].super_QArrayData = pcVar4;
    qVar5 = pQVar1[-1].data.d.size;
    pQVar1[-1].data.d.size = pDVar2[-2].super_QArrayData.alloc;
    pDVar2[-2].super_QArrayData.alloc = qVar5;
    pQVar6 = pQVar1[-1].address.d.d.ptr;
    pQVar1[-1].address.d.d.ptr = *(QHostAddressPrivate **)&pDVar2[-1].super_QArrayData;
    *(QHostAddressPrivate **)&pDVar2[-1].super_QArrayData = pQVar6;
    pQVar1[-1].port = (quint16)pDVar2[-1].super_QArrayData.alloc;
    ((d_first.current)->data).d.d =
         (Data *)&((d_first.current)->data).d.d[-3].super_QArrayData.alloc;
    ((first.current)->data).d.d = (Data *)&((first.current)->data).d.d[-3].super_QArrayData.alloc;
  }
  while (pQVar7 = (QSocks5RevivedDatagram *)((first.current)->data).d.d, pQVar7 != pQVar10) {
    ((first.current)->data).d.d = (Data *)(pQVar7 + 1);
    QHostAddress::~QHostAddress(&pQVar7->address);
    piVar8 = *(int **)&(pQVar7->data).d.d;
    if (piVar8 != (int *)0x0) {
      LOCK();
      *piVar8 = *piVar8 + -1;
      UNLOCK();
      if (*piVar8 == 0) {
        QArrayData::deallocate(*(QArrayData **)&(pQVar7->data).d.d,1,0x10);
      }
    }
  }
  q_relocate_overlap_n_left_move<std::reverse_iterator<QSocks5RevivedDatagram_*>,_long_long>::
  Destructor::~Destructor(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void q_relocate_overlap_n_left_move(iterator first, N n, iterator d_first)
{
    // requires: [first, n) is a valid range
    // requires: d_first + n is reachable from d_first
    // requires: iterator is at least a random access iterator
    // requires: value_type(iterator) has a non-throwing destructor

    Q_ASSERT(n);
    Q_ASSERT(d_first < first); // only allow moves to the "left"
    using T = typename std::iterator_traits<iterator>::value_type;

    // Watches passed iterator. Unless commit() is called, all the elements that
    // the watched iterator passes through are deleted at the end of object
    // lifetime. freeze() could be used to stop watching the passed iterator and
    // remain at current place.
    //
    // requires: the iterator is expected to always point to an invalid object
    //           (to uninitialized memory)
    struct Destructor
    {
        iterator *iter;
        iterator end;
        iterator intermediate;

        Destructor(iterator &it) noexcept : iter(std::addressof(it)), end(it) { }
        void commit() noexcept { iter = std::addressof(end); }
        void freeze() noexcept
        {
            intermediate = *iter;
            iter = std::addressof(intermediate);
        }
        ~Destructor() noexcept
        {
            for (const int step = *iter < end ? 1 : -1; *iter != end;) {
                std::advance(*iter, step);
                (*iter)->~T();
            }
        }
    } destroyer(d_first);

    const iterator d_last = d_first + n;
    // Note: use pair and explicitly copy iterators from it to prevent
    // accidental reference semantics instead of copy. equivalent to:
    //
    // auto [overlapBegin, overlapEnd] = std::minmax(d_last, first);
    auto pair = std::minmax(d_last, first);

    // overlap area between [d_first, d_first + n) and [first, first + n) or an
    // uninitialized memory area between the two ranges
    iterator overlapBegin = pair.first;
    iterator overlapEnd = pair.second;

    // move construct elements in uninitialized region
    while (d_first != overlapBegin) {
        // account for std::reverse_iterator, cannot use new(d_first) directly
        new (std::addressof(*d_first)) T(std::move_if_noexcept(*first));
        ++d_first;
        ++first;
    }

    // cannot commit but have to stop - there might be an overlap region
    // which we don't want to delete (because it's part of existing data)
    destroyer.freeze();

    // move assign elements in overlap region
    while (d_first != d_last) {
        *d_first = std::move_if_noexcept(*first);
        ++d_first;
        ++first;
    }

    Q_ASSERT(d_first == destroyer.end + n);
    destroyer.commit(); // can commit here as ~T() below does not throw

    while (first != overlapEnd)
        (--first)->~T();
}